

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

void core::image::save_ppm_16_file(ConstPtr *image,string *filename)

{
  shared_ptr<const_core::ImageBase> local_28;
  string *local_18;
  string *filename_local;
  ConstPtr *image_local;
  
  local_18 = filename;
  filename_local = (string *)image;
  std::shared_ptr<core::ImageBase_const>::shared_ptr<core::Image<unsigned_short>const,void>
            ((shared_ptr<core::ImageBase_const> *)&local_28,image);
  save_ppm_file_intern((ConstPtr *)&local_28,local_18);
  std::shared_ptr<const_core::ImageBase>::~shared_ptr(&local_28);
  return;
}

Assistant:

void
save_ppm_16_file (RawImage::ConstPtr image, std::string const& filename)
{
    save_ppm_file_intern(image, filename);
}